

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Package
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar7;
  undefined4 extraout_var_03;
  char *__end;
  long lVar8;
  cmCustomCommandLine singleLine;
  string configFile;
  GlobalTargetInfo gti;
  string local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  cmMakefile *local_f8;
  string local_f0;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *local_d0;
  undefined1 local_c8 [88];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_70;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  local_f8 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_d0 = targets;
  psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_f8);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + psVar5->_M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  bVar3 = cmsys::SystemTools::FileExists(&local_f0);
  if (!bVar3) goto LAB_0019cde0;
  lVar8 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,
               *(char **)((long)&AddGlobalTarget_Package(std::vector<cmGlobalGenerator::GlobalTargetInfo,std::allocator<cmGlobalGenerator::GlobalTargetInfo>>&)
                                 ::reservedTargets + lVar8),(allocator<char> *)&local_118);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"when CPack packaging is enabled","");
    bVar3 = CheckCMP0037(this,(string *)local_c8,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
    }
    if (!bVar3) goto LAB_0019cde0;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x10);
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x13])(this);
  pcVar7 = (char *)CONCAT44(extraout_var,iVar4);
  local_c8._32_8_ = local_c8 + 0x30;
  local_c8._0_8_ = local_c8 + 0x10;
  local_c8._8_8_ = (char *)0x0;
  local_c8[0x10] = '\0';
  local_c8._40_8_ = (char *)0x0;
  local_c8[0x30] = '\0';
  local_c8._64_8_ = (pointer)0x0;
  local_c8._72_8_ = (pointer)0x0;
  local_c8._80_8_ = (pointer)0x0;
  vStack_70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_38 = false;
  local_58._M_p = (pointer)&local_48;
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x1d])(this);
  uVar2 = local_c8._8_8_;
  strlen((char *)CONCAT44(extraout_var_00,iVar4));
  std::__cxx11::string::_M_replace((ulong)local_c8,0,(char *)uVar2,CONCAT44(extraout_var_00,iVar4));
  std::__cxx11::string::_M_replace((ulong)(local_c8 + 0x20),0,(char *)local_c8._40_8_,0x4dea33);
  local_38 = true;
  cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_f8);
  std::__cxx11::string::_M_assign((string *)&local_58);
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar5 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_118,psVar5);
  if (((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) && (*pcVar7 != '.')) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"-C","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               &local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    sVar6 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,pcVar7,pcVar7 + sVar6);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               &local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"--config","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
             &local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"./CPackConfig.cmake","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
             &local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
  emplace_back<cmCustomCommandLine>
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)(local_c8 + 0x40),
             (cmCustomCommandLine *)&local_118);
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x1b])(this);
  if (CONCAT44(extraout_var_01,iVar4) == 0) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY","");
    pcVar7 = cmMakefile::GetDefinition(local_f8,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (pcVar7 != (char *)0x0) {
      bVar3 = cmSystemTools::IsOff(pcVar7);
      if (!bVar3) goto LAB_0019cd4f;
    }
    iVar4 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
    local_138._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_03,iVar4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_70,
               (char **)&local_138);
  }
  else {
    iVar4 = (*this->_vptr_cmGlobalGenerator[0x1b])(this);
    local_138._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_02,iVar4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_70,
               (char **)&local_138);
  }
LAB_0019cd4f:
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(local_d0,(GlobalTargetInfo *)local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_70);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)(local_c8 + 0x40))
  ;
  if ((undefined1 *)local_c8._32_8_ != local_c8 + 0x30) {
    operator_delete((void *)local_c8._32_8_,CONCAT71(local_c8._49_7_,local_c8[0x30]) + 1);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
  }
LAB_0019cde0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Package(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  std::string configFile = mf->GetCurrentBinaryDirectory();
  configFile += "/CPackConfig.cmake";
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package", "PACKAGE" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target, "when CPack packaging is enabled")) {
      return;
    }
  }

  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetPackageTargetName();
  gti.Message = "Run CPack packaging tool...";
  gti.UsesTerminal = true;
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if (cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  }
  singleLine.push_back("--config");
  singleLine.push_back("./CPackConfig.cmake");
  gti.CommandLines.push_back(std::move(singleLine));
  if (this->GetPreinstallTargetName()) {
    gti.Depends.emplace_back(this->GetPreinstallTargetName());
  } else {
    const char* noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if (!noPackageAll || cmSystemTools::IsOff(noPackageAll)) {
      gti.Depends.emplace_back(this->GetAllTargetName());
    }
  }
  targets.push_back(std::move(gti));
}